

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier
          (KNearestNeighborsClassifier *this,Arena *arena,bool is_message_owned)

{
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__KNearestNeighborsClassifier_003fc278;
  this->nearestneighborsindex_ = (NearestNeighborsIndex *)0x0;
  this->numberofneighbors_ = (Int64Parameter *)0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  this->_oneof_case_[0] = 0;
  this->_oneof_case_[1] = 0;
  this->_oneof_case_[2] = 0;
  return;
}

Assistant:

KNearestNeighborsClassifier::KNearestNeighborsClassifier(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.KNearestNeighborsClassifier)
}